

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

void __thiscall ChunkedStackPool<4092>::Reset(ChunkedStackPool<4092> *this)

{
  StackChunk *pSVar1;
  
  pSVar1 = this->first;
  while (pSVar1 != (StackChunk *)0x0) {
    pSVar1 = pSVar1->next;
    (*(code *)NULLC::dealloc)();
    this->first = pSVar1;
  }
  this->first = (StackChunk *)0x0;
  this->curr = (StackChunk *)0x0;
  this->size = 0xffc;
  return;
}

Assistant:

void Reset()
	{
		while(first)
		{
			StackChunk *next = first->next;
			NULLC::dealloc(first);
			first = next;
		}
		curr = first = NULL;
		size = chunkSize;
	}